

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O1

int ExUtilReadFileToWebPData(char *filename,WebPData *webp_data)

{
  int iVar1;
  int iVar2;
  size_t size;
  uint8_t *data;
  size_t local_20;
  uint8_t *local_18;
  
  iVar2 = 0;
  if (webp_data != (WebPData *)0x0) {
    iVar1 = ImgIoUtilReadFile(filename,&local_18,&local_20);
    iVar2 = 0;
    if (iVar1 != 0) {
      webp_data->bytes = local_18;
      webp_data->size = local_20;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ExUtilReadFileToWebPData(const char* const filename,
                             WebPData* const webp_data) {
  const uint8_t* data;
  size_t size;
  if (webp_data == NULL) return 0;
  if (!ImgIoUtilReadFile(filename, &data, &size)) return 0;
  webp_data->bytes = data;
  webp_data->size = size;
  return 1;
}